

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre.cc
# Opt level: O0

bool __thiscall
re2::PCREWalker::PostVisit
          (PCREWalker *this,Regexp *re,bool parent_arg,bool pre_arg,bool *child_args,int nchild_args
          )

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  Rune RVar4;
  ParseFlags PVar5;
  Regexp **ppRVar6;
  int local_38;
  int i;
  int nchild_args_local;
  bool *child_args_local;
  bool pre_arg_local;
  bool parent_arg_local;
  Regexp *re_local;
  PCREWalker *this_local;
  
  for (local_38 = 0; local_38 < nchild_args; local_38 = local_38 + 1) {
    if ((child_args[local_38] & 1U) == 0) {
      return false;
    }
  }
  RVar2 = Regexp::op(re);
  switch(RVar2) {
  case kRegexpEmptyMatch:
  case kRegexpEndText:
    PVar5 = Regexp::parse_flags(re);
    PVar5 = operator&(PVar5,WasDollar);
    if (PVar5 != NoParseFlags) {
      return false;
    }
    break;
  case kRegexpLiteral:
    RVar4 = Regexp::rune(re);
    if (RVar4 == 0xb) {
      return false;
    }
    break;
  default:
    break;
  case kRegexpStar:
  case kRegexpPlus:
  case kRegexpQuest:
    ppRVar6 = Regexp::sub(re);
    bVar1 = CanBeEmptyString(*ppRVar6);
    if (bVar1) {
      return false;
    }
    break;
  case kRegexpRepeat:
    iVar3 = Regexp::max(re);
    if (iVar3 == -1) {
      ppRVar6 = Regexp::sub(re);
      bVar1 = CanBeEmptyString(*ppRVar6);
      if (bVar1) {
        return false;
      }
    }
    break;
  case kRegexpBeginLine:
    return false;
  }
  return true;
}

Assistant:

bool PCREWalker::PostVisit(Regexp* re, bool parent_arg, bool pre_arg,
                           bool* child_args, int nchild_args) {
  // If children failed, so do we.
  for (int i = 0; i < nchild_args; i++)
    if (!child_args[i])
      return false;

  // Otherwise look for other reasons to fail.
  switch (re->op()) {
    // Look for repeated empty string.
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      if (CanBeEmptyString(re->sub()[0]))
        return false;
      break;
    case kRegexpRepeat:
      if (re->max() == -1 && CanBeEmptyString(re->sub()[0]))
        return false;
      break;

    // Look for \v
    case kRegexpLiteral:
      if (re->rune() == '\v')
        return false;
      break;

    // Look for $ in single-line mode.
    case kRegexpEndText:
    case kRegexpEmptyMatch:
      if (re->parse_flags() & Regexp::WasDollar)
        return false;
      break;

    // Look for ^ in multi-line mode.
    case kRegexpBeginLine:
      // No condition: in single-line mode ^ becomes kRegexpBeginText.
      return false;

    default:
      break;
  }

  // Not proven guilty.
  return true;
}